

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall
TestNLHandler::OnComplementarity(TestNLHandler *this,int con_index,int var_index,ComplInfo info)

{
  Writer *this_00;
  long local_58 [2];
  ulong local_48;
  undefined8 local_38;
  ulong local_28;
  
  this_00 = WriteSep(this);
  local_58[0] = ((ulong)((info.flags_ & 2U) == 0) << 0x34) + -0x10000000000000;
  local_48 = (ulong)(uint)con_index;
  local_38 = 0x7ff0000000000000;
  if ((info.flags_ & 1U) == 0) {
    local_38 = 0;
  }
  local_28 = (ulong)(uint)var_index;
  fmt::BasicWriter<char>::write(this_00,0x26c21c,(void *)0x2828,(size_t)local_58);
  return;
}

Assistant:

void OnComplementarity(int con_index, int var_index, mp::ComplInfo info) {
    WriteSep().write("{} <= c{} <= {} complements v{};",
                     info.con_lb(), con_index, info.con_ub(), var_index);
  }